

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

int add_A_record(record *record,void *data)

{
  undefined8 uVar1;
  char *__s;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  time_t tVar9;
  undefined8 *puVar10;
  size_t sVar11;
  char *__dest;
  int iVar12;
  
  iVar12 = 0;
  tVar9 = time((time_t *)0x0);
  if (tVar9 <= *(long *)((long)data + 0x30)) {
    if (record->size < 1) {
      puVar10 = (undefined8 *)malloc(0x40);
      record->data = puVar10;
      uVar1 = *(undefined8 *)((long)data + 8);
      uVar2 = *(undefined8 *)((long)data + 0x10);
      uVar3 = *(undefined8 *)((long)data + 0x18);
      uVar4 = *(undefined8 *)((long)data + 0x20);
      uVar5 = *(undefined8 *)((long)data + 0x28);
      uVar6 = *(undefined8 *)((long)data + 0x30);
      uVar7 = *(undefined8 *)((long)data + 0x38);
      *puVar10 = *data;
      puVar10[1] = uVar1;
      puVar10[2] = uVar2;
      puVar10[3] = uVar3;
      puVar10[4] = uVar4;
      puVar10[5] = uVar5;
      puVar10[6] = uVar6;
      puVar10[7] = uVar7;
      __s = *data;
      sVar11 = strlen(__s);
      __dest = (char *)malloc((long)((int)sVar11 + 1));
      *puVar10 = __dest;
      strcpy(__dest,__s);
      iVar12 = (int)sVar11 + 0x41;
      record->size = iVar12;
      puVar10[7] = 0;
    }
    else {
      puVar10 = (undefined8 *)record->data;
      uVar1 = puVar10[7];
      uVar2 = *(undefined8 *)((long)data + 8);
      uVar3 = *(undefined8 *)((long)data + 0x10);
      uVar4 = *(undefined8 *)((long)data + 0x18);
      uVar5 = *(undefined8 *)((long)data + 0x20);
      uVar6 = *(undefined8 *)((long)data + 0x28);
      uVar7 = *(undefined8 *)((long)data + 0x30);
      uVar8 = *(undefined8 *)((long)data + 0x38);
      *puVar10 = *data;
      puVar10[1] = uVar2;
      puVar10[2] = uVar3;
      puVar10[3] = uVar4;
      puVar10[4] = uVar5;
      puVar10[5] = uVar6;
      puVar10[6] = uVar7;
      puVar10[7] = uVar8;
      *(undefined8 *)((long)record->data + 0x38) = uVar1;
      iVar12 = record->size;
    }
  }
  return iVar12;
}

Assistant:

int add_A_record(struct record*record,void*data){
  time_t now = time(NULL);
  struct record_data*tmp;
  int len = 0;
  if(((struct record_data*)data)->ttl<now)return 0;
  int sizeofstruct = sizeof(struct record_data);
  if(record->size>0){
    //目前不可能执行这一段
    #ifdef LOG_INCLUDED
    log_debug("replace new A record;label= %s",((struct record_data*)record->data)->label);
    #endif 
    tmp = ((struct record_data*)record->data)->next;
    // memcpy_s(record->data,sizeofstruct,data,sizeofstruct);//覆盖原数据
    memcpy(record->data,data,sizeofstruct);//覆盖原数据
    ((struct record_data*)record->data)->next=tmp;
  }else{
    #ifdef LOG_INCLUDED
    log_debug("record has no data before");
    #endif 
    record->data = malloc(sizeofstruct);
    memcpy(record->data,data,sizeofstruct);
    // memcpy_s(record->data,sizeofstruct,data,sizeofstruct);
    len = strlen(((struct record_data*)data)->label) + 1;//注意加1
    ((struct record_data*)record->data)->label = malloc(len);
    strcpy(((struct record_data*)record->data)->label,((struct record_data*)data)->label);//复制name
    // strcpy_s(((struct record_data*)record->data)->label,len,((struct record_data*)data)->label);//复制name
    record->size = sizeofstruct + len;
    #ifdef LOG_INCLUDED
    log_debug("add new A record;label= %s,ip=%d",((struct record_data*)record->data)->label,((struct record_data*)record->data)->ip.addr.v4);
    #endif 
    ((struct record_data*)record->data)->next=NULL;
  }
  return record->size;
}